

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::paintEvent(Stepper *this,QPaintEvent *param_1)

{
  int iVar1;
  StepperPrivate *pSVar2;
  double w;
  QRect QVar3;
  QColor QVar4;
  QBrush local_110 [8];
  QPen local_108 [8];
  undefined6 local_100;
  undefined2 uStack_fa;
  undefined6 local_f8;
  undefined2 uStack_f2;
  undefined6 local_f0;
  undefined2 local_ea;
  undefined6 uStack_e8;
  QBrush local_e0 [8];
  QPen local_d8 [8];
  QBrush local_d0 [8];
  QPen local_c8 [8];
  undefined6 local_c0;
  undefined2 uStack_ba;
  undefined6 local_b8;
  undefined2 uStack_b2;
  undefined6 local_b0;
  undefined2 local_aa;
  undefined6 uStack_a8;
  QBrush local_a0 [8];
  QPen local_98 [8];
  int local_90;
  int local_8c;
  int plusCenterX;
  int centerY;
  int minusCenterX;
  int signSize;
  QPainterPath local_78 [8];
  QPainterPath plusButton;
  QPainterPath minusButton;
  qreal arcSize;
  undefined8 local_58;
  qreal local_50;
  qreal height;
  undefined8 local_40;
  double local_38;
  qreal width;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  Stepper *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  QPainter::translate(local_20,1.0,1.0);
  QVar3 = QWidget::rect(&this->super_QWidget);
  local_40 = QVar3._8_8_;
  height = QVar3._0_8_;
  iVar1 = QRect::width((QRect *)&height);
  local_38 = (double)(iVar1 + -2);
  QVar3 = QWidget::rect(&this->super_QWidget);
  local_58 = QVar3._8_8_;
  arcSize = QVar3._0_8_;
  iVar1 = QRect::height((QRect *)&arcSize);
  local_50 = (qreal)(iVar1 + -2);
  w = local_38 * 0.2;
  QPainterPath::QPainterPath(&plusButton);
  QPainterPath::moveTo(&plusButton,local_38 * 0.5,local_50);
  QPainterPath::lineTo(&plusButton,w * 0.5,local_50);
  QPainterPath::arcTo(&plusButton,0.0,local_50 - w,w,w,-90.0,-90.0);
  QPainterPath::lineTo(&plusButton,0.0,w * 0.5);
  QPainterPath::arcTo(&plusButton,0.0,0.0,w,w,-180.0,-90.0);
  QPainterPath::lineTo(&plusButton,local_38 * 0.5,0.0);
  QPainterPath::closeSubpath();
  QPainterPath::QPainterPath(local_78);
  QPainterPath::moveTo(local_78,local_38 * 0.5,0.0);
  QPainterPath::lineTo(local_78,local_38 + w * -0.5,0.0);
  QPainterPath::arcTo(local_78,local_38 - w,0.0,w,w,90.0,-90.0);
  QPainterPath::lineTo(local_78,local_38,local_50 + w * -0.5);
  QPainterPath::arcTo(local_78,local_38 - w,local_50 - w,w,w,0.0,-90.0);
  QPainterPath::lineTo(local_78,local_38 * 0.5,local_50);
  QPainterPath::closeSubpath();
  QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>::
  operator->(&this->d);
  QPainter::setPen((QColor *)local_20);
  QBrush::QBrush((QBrush *)&minusCenterX,white,SolidPattern);
  QPainter::setBrush((QBrush *)local_20);
  QBrush::~QBrush((QBrush *)&minusCenterX);
  QPainter::drawPath((QPainterPath *)local_20);
  QPainter::drawPath((QPainterPath *)local_20);
  centerY = qRound(local_50 * 0.25);
  plusCenterX = qRound(local_38 * 0.25);
  local_8c = qRound(local_50 * 0.5);
  local_90 = plusCenterX * 3;
  pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  if ((pSVar2->minusButtonEnabled & 1U) == 0) {
    pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    QVar4 = lighterColor(&pSVar2->color,0x32);
    local_c0 = QVar4._0_6_;
    uStack_ba = QVar4.ct._2_2_;
    local_b8 = QVar4.ct._4_6_;
    uStack_b2 = QVar4._14_2_;
    uStack_a8 = local_b8;
    local_b0 = local_c0;
    local_aa = uStack_ba;
    QBrush::QBrush(local_a0,(QColor *)&local_b0,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_98,local_a0,1,0x10,0x40);
    QPainter::setPen((QPen *)local_20);
    QPen::~QPen(local_98);
    QBrush::~QBrush(local_a0);
  }
  else {
    pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush(local_d0,(QColor *)&pSVar2->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_c8,local_d0,1,0x10,0x40);
    QPainter::setPen((QPen *)local_20);
    QPen::~QPen(local_c8);
    QBrush::~QBrush(local_d0);
  }
  QPainter::drawLine(local_20,plusCenterX - centerY,local_8c,plusCenterX + centerY,local_8c);
  pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  if ((pSVar2->plusButtonEnabled & 1U) == 0) {
    pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    QVar4 = lighterColor(&pSVar2->color,0x32);
    local_100 = QVar4._0_6_;
    uStack_fa = QVar4.ct._2_2_;
    local_f8 = QVar4.ct._4_6_;
    uStack_f2 = QVar4._14_2_;
    uStack_e8 = local_f8;
    local_f0 = local_100;
    local_ea = uStack_fa;
    QBrush::QBrush(local_e0,(QColor *)&local_f0,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_d8,local_e0,1,0x10,0x40);
    QPainter::setPen((QPen *)local_20);
    QPen::~QPen(local_d8);
    QBrush::~QBrush(local_e0);
  }
  else {
    pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush(local_110,(QColor *)&pSVar2->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_108,local_110,1,0x10,0x40);
    QPainter::setPen((QPen *)local_20);
    QPen::~QPen(local_108);
    QBrush::~QBrush(local_110);
  }
  QPainter::drawLine(local_20,local_90 - centerY,local_8c,local_90 + centerY,local_8c);
  QPainter::drawLine(local_20,local_90,local_8c - centerY,local_90,local_8c + centerY);
  QPainterPath::~QPainterPath(local_78);
  QPainterPath::~QPainterPath(&plusButton);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
Stepper::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	const qreal width = rect().width() - 2;
	const qreal height = rect().height() - 2;
	const qreal arcSize = width * 0.2;

	QPainterPath minusButton;
	minusButton.moveTo( width / 2.0, height );
	minusButton.lineTo( arcSize / 2.0, height );
	minusButton.arcTo( 0.0, height - arcSize, arcSize, arcSize,
		-90.0, -90.0 );
	minusButton.lineTo( 0.0, arcSize / 2.0 );
	minusButton.arcTo( 0.0, 0.0, arcSize, arcSize, -180.0, -90.0 );
	minusButton.lineTo( width / 2.0, 0.0 );
	minusButton.closeSubpath();

	QPainterPath plusButton;
	plusButton.moveTo( width / 2.0, 0.0 );
	plusButton.lineTo( width - arcSize / 2.0, 0.0 );
	plusButton.arcTo( width - arcSize, 0.0, arcSize, arcSize,
		90.0, -90.0 );
	plusButton.lineTo( width, height - arcSize / 2.0 );
	plusButton.arcTo( width - arcSize, height - arcSize,
		arcSize, arcSize, 0.0, -90.0 );
	plusButton.lineTo( width / 2.0, height );
	plusButton.closeSubpath();

	p.setPen( d->color );
	p.setBrush( Qt::white );

	p.drawPath( minusButton );
	p.drawPath( plusButton );

	const int signSize = qRound( height / 4.0 );
	const int minusCenterX = qRound( width / 4.0 );
	const int centerY = qRound( height / 2.0 );
	const int plusCenterX = minusCenterX * 3;

	if( !d->minusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( minusCenterX - signSize, centerY,
		minusCenterX + signSize, centerY );

	if( !d->plusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( plusCenterX - signSize, centerY,
		plusCenterX + signSize, centerY );
	p.drawLine( plusCenterX, centerY - signSize,
		plusCenterX, centerY + signSize );
}